

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Opnd * __thiscall Lowerer::CreateOpndForSlotAccess(Lowerer *this,Opnd *opnd)

{
  bool bVar1;
  int iVar2;
  SymOpnd *pSVar3;
  PropertySym *pPVar4;
  JITTimeFunctionBody *pJVar5;
  AsmJsJITInfo *this_00;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar6;
  StackSym *pSVar7;
  Func *pFVar8;
  int offset;
  
  pSVar3 = IR::Opnd::AsSymOpnd(opnd);
  pPVar4 = Sym::AsPropertySym(pSVar3->m_sym);
  bVar1 = Func::IsLoopBody(this->m_func);
  pFVar8 = this->m_func;
  if (((!bVar1) && (pFVar8->stackClosure == true)) &&
     ((pSVar7 = pPVar4->m_stackSym, pSVar7 == pFVar8->m_localClosureSym ||
      (pSVar7 == pFVar8->m_localFrameDisplaySym)))) {
    pSVar3 = IR::SymOpnd::New(&pSVar7->super_Sym,0,TyInt64,pFVar8);
    pSVar7 = IR::Opnd::GetStackSym(&pSVar3->super_Opnd);
    pSVar7->field_0x1b = pSVar7->field_0x1b | 0x10;
    return &pSVar3->super_Opnd;
  }
  offset = pPVar4->m_propertyId;
  pJVar5 = Func::GetJITFunctionBody(pFVar8);
  bVar1 = JITTimeFunctionBody::IsAsmJsMode(pJVar5);
  if (!bVar1) {
    offset = offset * TySize[opnd->m_type];
  }
  pFVar8 = this->m_func;
  if ((pFVar8->field_0x242 & 2) != 0) {
    pJVar5 = Func::GetJITFunctionBody(pFVar8);
    this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar5);
    iVar2 = AsmJsJITInfo::GetTotalSizeInBytes(this_00);
    offset = offset - iVar2;
    pFVar8 = this->m_func;
  }
  baseOpnd = IR::SymOpnd::CreatePropertyOwnerOpnd(pSVar3,pFVar8);
  pIVar6 = IR::IndirOpnd::New(baseOpnd,offset,opnd->m_type,this->m_func,false);
  return &pIVar6->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::CreateOpndForSlotAccess(IR::Opnd * opnd)
{
    IR::SymOpnd * symOpnd = opnd->AsSymOpnd();
    PropertySym * dstSym = symOpnd->m_sym->AsPropertySym();

    if (!m_func->IsLoopBody() &&
        m_func->DoStackFrameDisplay() &&
        (dstSym->m_stackSym == m_func->GetLocalClosureSym() || dstSym->m_stackSym == m_func->GetLocalFrameDisplaySym()))
    {
        // Stack closure syms are made to look like slot accesses for the benefit of GlobOpt, so that it can do proper
        // copy prop and implicit call bailout. But what we really want is local stack load/store.
        // Don't do this for loop body, though, since we don't have the value saved on the stack.
        IR::SymOpnd * closureSym = IR::SymOpnd::New(dstSym->m_stackSym, 0, TyMachReg, this->m_func);
        closureSym->GetStackSym()->m_isClosureSym = true;
        return closureSym;
    }

    int32 offset = dstSym->m_propertyId;
    if (!m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        offset = offset * TySize[opnd->GetType()];
    }
#ifdef ASMJS_PLAT
    if (m_func->IsTJLoopBody())
    {
        offset = offset - m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetTotalSizeInBytes();
    }
#endif

    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(symOpnd->CreatePropertyOwnerOpnd(m_func),
       offset , opnd->GetType(), this->m_func);
    return indirOpnd;
}